

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  int iVar1;
  xmlNodePtr node;
  int iVar2;
  int iVar3;
  uint uVar4;
  xmlXIncludeRefPtr pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  char *msg;
  _xmlNode *p_Var8;
  long lVar9;
  _xmlNode *p_Var10;
  char *extra;
  
  iVar2 = -1;
  if ((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) {
    iVar1 = ctxt->incNr;
    lVar9 = (long)iVar1;
    p_Var8 = tree;
    do {
      if ((((p_Var8 == (xmlNodePtr)0x0) || (p_Var8->type != XML_ELEMENT_NODE)) ||
          (p_Var8->ns == (xmlNs *)0x0)) ||
         ((iVar2 = xmlStrEqual(p_Var8->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
          iVar2 == 0 &&
          (iVar2 = xmlStrEqual(p_Var8->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
          iVar2 == 0)))) {
LAB_00195d51:
        if ((p_Var8->children == (xmlNodePtr)0x0) ||
           (pxVar6 = p_Var8->children, (p_Var8->type | XML_COMMENT_NODE) != XML_DOCUMENT_NODE))
        goto LAB_00195d66;
      }
      else {
        iVar2 = xmlStrEqual(p_Var8->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude");
        if ((iVar2 != 0) && (ctxt->legacy == 0)) {
          ctxt->legacy = 1;
        }
        iVar2 = xmlStrEqual(p_Var8->name,(xmlChar *)"include");
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(p_Var8->name,(xmlChar *)"fallback");
          if ((iVar2 != 0) &&
             (((p_Var10 = p_Var8->parent, p_Var10 == (_xmlNode *)0x0 ||
               (p_Var10->type != XML_ELEMENT_NODE)) ||
              ((p_Var10->ns == (xmlNs *)0x0 ||
               (((iVar2 = xmlStrEqual(p_Var10->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"
                                     ), iVar2 == 0 &&
                 (iVar2 = xmlStrEqual(p_Var8->parent->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar2 == 0)) ||
                (iVar2 = xmlStrEqual(p_Var8->parent->name,(xmlChar *)"include"), iVar2 == 0))))))))
          {
            iVar2 = 0x650;
            msg = "%s is not the child of an \'include\'\n";
            extra = "fallback";
LAB_00195d4c:
            xmlXIncludeErr(ctxt,p_Var8,iVar2,msg,(xmlChar *)extra);
          }
          goto LAB_00195d51;
        }
        p_Var10 = p_Var8->children;
        if (p_Var10 != (_xmlNode *)0x0) {
          iVar2 = 0;
          do {
            if (((p_Var10->type == XML_ELEMENT_NODE) && (p_Var10->ns != (xmlNs *)0x0)) &&
               ((iVar3 = xmlStrEqual(p_Var10->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude")
                , iVar3 != 0 ||
                (iVar3 = xmlStrEqual(p_Var10->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude")
                , iVar3 != 0)))) {
              iVar3 = xmlStrEqual(p_Var10->name,(xmlChar *)"include");
              if (iVar3 != 0) {
                iVar2 = 0x64e;
                msg = "%s has an \'include\' child\n";
                goto LAB_00195d45;
              }
              iVar3 = xmlStrEqual(p_Var10->name,(xmlChar *)"fallback");
              iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
            }
            p_Var10 = p_Var10->next;
          } while (p_Var10 != (_xmlNode *)0x0);
          if (1 < iVar2) {
            iVar2 = 0x64f;
            msg = "%s has multiple fallback children\n";
LAB_00195d45:
            extra = "include";
            goto LAB_00195d4c;
          }
        }
        ctxt->incTotal = ctxt->incTotal + 1;
        pxVar5 = xmlXIncludeExpandNode(ctxt,p_Var8);
        if (pxVar5 != (xmlXIncludeRefPtr)0x0) {
          pxVar5->replace = 1;
        }
LAB_00195d66:
        do {
          pxVar6 = p_Var8;
          if ((p_Var8 == tree) || (pxVar6 = p_Var8->next, p_Var8->next != (xmlNodePtr)0x0))
          goto LAB_00195d84;
          p_Var8 = p_Var8->parent;
        } while (p_Var8 != (_xmlNode *)0x0);
        pxVar6 = (xmlNodePtr)0x0;
      }
LAB_00195d84:
    } while ((pxVar6 != (xmlNodePtr)0x0) && (p_Var8 = pxVar6, pxVar6 != tree));
    iVar2 = 0;
    if (iVar1 < ctxt->incNr) {
      iVar2 = 0;
      do {
        pxVar5 = ctxt->incTab[lVar9];
        pxVar6 = pxVar5->inc;
        if (pxVar5->replace == 0) {
          if (pxVar6 != (xmlNodePtr)0x0) {
            xmlFreeNodeList(pxVar6);
            ctxt->incTab[lVar9]->inc = (xmlNodePtr)0x0;
          }
        }
        else {
          if (pxVar6 == (xmlNodePtr)0x0) {
            if ((pxVar5 != (xmlXIncludeRefPtr)0x0) && (pxVar5->emptyFb != 0)) goto LAB_00195e04;
          }
          else if (pxVar5 != (xmlXIncludeRefPtr)0x0) {
LAB_00195e04:
            node = pxVar5->elem;
            if ((node != (xmlNodePtr)0x0) && (node->type != XML_NAMESPACE_DECL)) {
              pxVar5->inc = (xmlNodePtr)0x0;
              pxVar5->emptyFb = 0;
              if ((node->parent != (_xmlNode *)0x0) &&
                 ((pxVar6 != (xmlNodePtr)0x0 && (node->parent->type != XML_ELEMENT_NODE)))) {
                uVar4 = 0;
                p_Var8 = pxVar6;
                do {
                  uVar4 = uVar4 + (p_Var8->type == XML_ELEMENT_NODE);
                  p_Var8 = p_Var8->next;
                } while (p_Var8 != (_xmlNode *)0x0);
                if (1 < uVar4) {
                  xmlXIncludeErr(ctxt,node,0x64b,
                                 "XInclude error: would result in multiple root nodes\n",
                                 (xmlChar *)0x0);
                  xmlFreeNodeList(pxVar6);
                  goto LAB_00195f89;
                }
              }
              if ((ctxt->parseFlags & 0x8000) == 0) {
                if (pxVar5->fallback != 0) {
                  xmlUnsetProp(node,"href");
                }
                node->type = XML_XINCLUDE_START;
                pxVar7 = node->children;
                while (pxVar7 != (xmlNodePtr)0x0) {
                  p_Var8 = pxVar7->next;
                  xmlUnlinkNode(pxVar7);
                  xmlFreeNode(pxVar7);
                  pxVar7 = p_Var8;
                }
                pxVar7 = xmlNewDocNode(node->doc,node->ns,node->name,(xmlChar *)0x0);
                if (pxVar7 == (xmlNodePtr)0x0) {
                  xmlXIncludeErr(ctxt,pxVar5->elem,0x649,"failed to build node\n",(xmlChar *)0x0);
                  xmlFreeNodeList(pxVar6);
                }
                else {
                  pxVar7->type = XML_XINCLUDE_END;
                  xmlAddNextSibling(node,pxVar7);
                  while (pxVar6 != (xmlNodePtr)0x0) {
                    p_Var8 = pxVar6->next;
                    xmlAddPrevSibling(pxVar7,pxVar6);
                    pxVar6 = p_Var8;
                  }
                }
              }
              else {
                while (pxVar6 != (xmlNodePtr)0x0) {
                  p_Var8 = pxVar6->next;
                  xmlAddPrevSibling(node,pxVar6);
                  pxVar6 = p_Var8;
                }
                xmlUnlinkNode(node);
                xmlFreeNode(node);
              }
            }
          }
LAB_00195f89:
          ctxt->incTab[lVar9]->replace = 0;
        }
        iVar2 = iVar2 + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 < ctxt->incNr);
    }
    if (ctxt->isStream != 0) {
      if (0 < ctxt->incNr) {
        lVar9 = 0;
        do {
          xmlXIncludeFreeRef(ctxt->incTab[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < ctxt->incNr);
      }
      ctxt->incNr = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return(-1);
    if (ctxt == NULL)
	return(-1);

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
            /*
             * Avoid superlinear expansion by limiting the total number
             * of replacements.
             */
            if (ctxt->incTotal >= 20)
                break;
#endif
            ctxt->incTotal++;
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            if ((ctxt->incTab[i]->inc != NULL) ||
                (ctxt->incTab[i]->emptyFb != 0)) {	/* (empty fallback) */
                xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            }
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}